

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O0

void __thiscall
CMU462::Camera::place
          (Camera *this,Vector3D *targetPos,double phi,double theta,double r,double minR,double maxR
          )

{
  double dVar1;
  double *pdVar2;
  undefined8 *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  double phi_;
  double r_;
  Camera *in_stack_00000070;
  double local_58;
  double local_38;
  double local_30;
  double local_28;
  undefined8 local_20;
  double local_18;
  undefined8 *local_10;
  
  local_20 = CONCAT44(in_XMM1_Db,in_XMM1_Da);
  local_38 = in_XMM4_Qa;
  local_30 = in_XMM3_Qa;
  local_18 = in_XMM0_Qa;
  local_10 = in_RSI;
  pdVar2 = std::max<double>(&local_28,&local_30);
  pdVar2 = std::min<double>(pdVar2,&local_38);
  dVar1 = *pdVar2;
  dVar3 = sin(local_18);
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    local_58 = local_18;
  }
  else {
    local_58 = local_18 + 9.999999747378752e-06;
  }
  *(undefined8 *)(in_RDI + 0x40) = *local_10;
  *(undefined8 *)(in_RDI + 0x48) = local_10[1];
  *(undefined8 *)(in_RDI + 0x50) = local_10[2];
  *(double *)(in_RDI + 0x58) = local_58;
  *(undefined8 *)(in_RDI + 0x60) = local_20;
  *(double *)(in_RDI + 0x68) = dVar1;
  *(double *)(in_RDI + 0x70) = local_30;
  *(double *)(in_RDI + 0x78) = local_38;
  compute_position(in_stack_00000070);
  return;
}

Assistant:

void Camera::place(const Vector3D& targetPos, const double phi,
                   const double theta, const double r, const double minR,
                   const double maxR) {
  double r_ = min(max(r, minR), maxR);
  double phi_ = (sin(phi) == 0) ? (phi + EPS_F) : phi;
  this->targetPos = targetPos;
  this->phi = phi_;
  this->theta = theta;
  this->r = r_;
  this->minR = minR;
  this->maxR = maxR;
  compute_position();
}